

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_response.c
# Opt level: O0

char * nhr_response_find_http_field_value(char *received,char *field)

{
  size_t sVar1;
  ushort **ppuVar2;
  char *local_28;
  char *sub;
  char *field_local;
  char *received_local;
  
  local_28 = strstr(received,field);
  if (local_28 == (char *)0x0) {
    received_local = (char *)0x0;
  }
  else {
    sVar1 = strlen(field);
    local_28 = local_28 + sVar1;
    while( true ) {
      ppuVar2 = __ctype_b_loc();
      if (((*ppuVar2)[(int)*local_28] & 8) != 0) break;
      local_28 = local_28 + 1;
    }
    received_local = local_28;
  }
  return received_local;
}

Assistant:

char * nhr_response_find_http_field_value(char * received, const char * field) {
	char * sub = strstr(received, field);
	if (!sub) {
		return NULL;
	}

	sub += strlen(field);
	while (!isalnum(*sub)) {
		sub++;
	}

	return sub;
}